

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_buffer_encoder.c
# Opt level: O0

lzma_ret block_buffer_encode(lzma_block *block,lzma_allocator *allocator,uint8_t *in,size_t in_size,
                            uint8_t *out,size_t *out_pos,size_t out_size,_Bool try_to_compress)

{
  size_t sVar1;
  lzma_bool lVar2;
  uint32_t uVar3;
  lzma_ret lVar4;
  long lVar5;
  ulong __n;
  ulong out_size_00;
  uint64_t uVar6;
  undefined1 local_c8 [8];
  lzma_check_state check;
  size_t i;
  lzma_ret ret_;
  lzma_ret ret;
  size_t check_size;
  _Bool try_to_compress_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  size_t in_size_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  lzma_block *block_local;
  
  if ((block == (lzma_block *)0x0) ||
     ((((in == (uint8_t *)0x0 && (in_size != 0)) || (out == (uint8_t *)0x0)) ||
      ((out_pos == (size_t *)0x0 || (out_size < *out_pos)))))) {
    block_local._4_4_ = LZMA_PROG_ERROR;
  }
  else if (block->version < 2) {
    if ((0xf < block->check) || ((try_to_compress && (block->filters == (lzma_filter *)0x0)))) {
      block_local._4_4_ = LZMA_PROG_ERROR;
    }
    else {
      lVar2 = lzma_check_is_supported(block->check);
      if (lVar2 == '\0') {
        block_local._4_4_ = LZMA_UNSUPPORTED_CHECK;
      }
      else {
        lVar5 = out_size - (out_size - *out_pos & 3);
        uVar3 = lzma_check_size(block->check);
        __n = (ulong)uVar3;
        if (__n == 0xffffffff) {
          __assert_fail("check_size != UINT32_MAX",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                        ,0xfd,
                        "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                       );
        }
        if (__n < lVar5 - *out_pos) {
          out_size_00 = lVar5 - __n;
          block->uncompressed_size = in_size;
          uVar6 = lzma2_bound(in_size);
          block->compressed_size = uVar6;
          if (block->compressed_size == 0) {
            block_local._4_4_ = LZMA_DATA_ERROR;
          }
          else {
            i._4_4_ = LZMA_BUF_ERROR;
            if (try_to_compress) {
              i._4_4_ = block_encode_normal(block,allocator,in,in_size,out,out_pos,out_size_00);
            }
            if (i._4_4_ != LZMA_OK) {
              if (i._4_4_ != LZMA_BUF_ERROR) {
                return i._4_4_;
              }
              lVar4 = block_encode_uncompressed(block,in,in_size,out,out_pos,out_size_00);
              if (lVar4 != LZMA_OK) {
                return lVar4;
              }
            }
            if (out_size_00 < *out_pos) {
              __assert_fail("*out_pos <= out_size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                            ,0x121,
                            "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                           );
            }
            for (check.state.sha256.size = block->compressed_size;
                (check.state.sha256.size & 3) != 0;
                check.state.sha256.size = check.state.sha256.size + 1) {
              if (out_size_00 <= *out_pos) {
                __assert_fail("*out_pos < out_size",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/block_buffer_encoder.c"
                              ,0x127,
                              "lzma_ret block_buffer_encode(lzma_block *, const lzma_allocator *, const uint8_t *, size_t, uint8_t *, size_t *, size_t, _Bool)"
                             );
              }
              sVar1 = *out_pos;
              *out_pos = sVar1 + 1;
              out[sVar1] = '\0';
            }
            if (__n != 0) {
              lzma_check_init((lzma_check_state *)local_c8,block->check);
              lzma_check_update((lzma_check_state *)local_c8,block->check,in,in_size);
              lzma_check_finish((lzma_check_state *)local_c8,block->check);
              memcpy(block->raw_check,local_c8,__n);
              memcpy(out + *out_pos,local_c8,__n);
              *out_pos = __n + *out_pos;
            }
            block_local._4_4_ = LZMA_OK;
          }
        }
        else {
          block_local._4_4_ = LZMA_BUF_ERROR;
        }
      }
    }
  }
  else {
    block_local._4_4_ = LZMA_OPTIONS_ERROR;
  }
  return block_local._4_4_;
}

Assistant:

static lzma_ret
block_buffer_encode(lzma_block *block, const lzma_allocator *allocator,
		const uint8_t *in, size_t in_size,
		uint8_t *out, size_t *out_pos, size_t out_size,
		bool try_to_compress)
{
	// Validate the arguments.
	if (block == NULL || (in == NULL && in_size != 0) || out == NULL
			|| out_pos == NULL || *out_pos > out_size)
		return LZMA_PROG_ERROR;

	// The contents of the structure may depend on the version so
	// check the version before validating the contents of *block.
	if (block->version > 1)
		return LZMA_OPTIONS_ERROR;

	if ((unsigned int)(block->check) > LZMA_CHECK_ID_MAX
			|| (try_to_compress && block->filters == NULL))
		return LZMA_PROG_ERROR;

	if (!lzma_check_is_supported(block->check))
		return LZMA_UNSUPPORTED_CHECK;

	// Size of a Block has to be a multiple of four, so limit the size
	// here already. This way we don't need to check it again when adding
	// Block Padding.
	out_size -= (out_size - *out_pos) & 3;

	// Get the size of the Check field.
	const size_t check_size = lzma_check_size(block->check);
	assert(check_size != UINT32_MAX);

	// Reserve space for the Check field.
	if (out_size - *out_pos <= check_size)
		return LZMA_BUF_ERROR;

	out_size -= check_size;

	// Initialize block->uncompressed_size and calculate the worst-case
	// value for block->compressed_size.
	block->uncompressed_size = in_size;
	block->compressed_size = lzma2_bound(in_size);
	if (block->compressed_size == 0)
		return LZMA_DATA_ERROR;

	// Do the actual compression.
	lzma_ret ret = LZMA_BUF_ERROR;
	if (try_to_compress)
		ret = block_encode_normal(block, allocator,
				in, in_size, out, out_pos, out_size);

	if (ret != LZMA_OK) {
		// If the error was something else than output buffer
		// becoming full, return the error now.
		if (ret != LZMA_BUF_ERROR)
			return ret;

		// The data was uncompressible (at least with the options
		// given to us) or the output buffer was too small. Use the
		// uncompressed chunks of LZMA2 to wrap the data into a valid
		// Block. If we haven't been given enough output space, even
		// this may fail.
		return_if_error(block_encode_uncompressed(block, in, in_size,
				out, out_pos, out_size));
	}

	assert(*out_pos <= out_size);

	// Block Padding. No buffer overflow here, because we already adjusted
	// out_size so that (out_size - out_start) is a multiple of four.
	// Thus, if the buffer is full, the loop body can never run.
	for (size_t i = (size_t)(block->compressed_size); i & 3; ++i) {
		assert(*out_pos < out_size);
		out[(*out_pos)++] = 0x00;
	}

	// If there's no Check field, we are done now.
	if (check_size > 0) {
		// Calculate the integrity check. We reserved space for
		// the Check field earlier so we don't need to check for
		// available output space here.
		lzma_check_state check;
		lzma_check_init(&check, block->check);
		lzma_check_update(&check, block->check, in, in_size);
		lzma_check_finish(&check, block->check);

		memcpy(block->raw_check, check.buffer.u8, check_size);
		memcpy(out + *out_pos, check.buffer.u8, check_size);
		*out_pos += check_size;
	}

	return LZMA_OK;
}